

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int32_t zng_inflatePrime(zng_stream *strm,int32_t bits,int32_t value)

{
  uint uVar1;
  internal_state *piVar2;
  int iVar3;
  
  iVar3 = inflateStateCheck(strm);
  if (iVar3 != 0) {
    return -2;
  }
  if (bits != 0) {
    piVar2 = strm->state;
    if (bits < 0) {
      piVar2->prev = (Pos *)0x0;
      *(undefined4 *)&piVar2->head = 0;
    }
    else {
      if (0x10 < (uint)bits) {
        return -2;
      }
      uVar1 = *(int *)&piVar2->head + bits;
      if (0x20 < uVar1) {
        return -2;
      }
      piVar2->prev = (Pos *)((long)piVar2->prev +
                            ((ulong)(~(uint)(-1L << ((byte)bits & 0x3f)) & value) <<
                            ((byte)*(int *)&piVar2->head & 0x3f)));
      *(uint *)&piVar2->head = uVar1;
    }
  }
  return 0;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflatePrime)(PREFIX3(stream) *strm, int32_t bits, int32_t value) {
    struct inflate_state *state;

    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    if (bits == 0)
        return Z_OK;
    INFLATE_PRIME_HOOK(strm, bits, value);  /* hook for IBM Z DFLTCC */
    state = (struct inflate_state *)strm->state;
    if (bits < 0) {
        state->hold = 0;
        state->bits = 0;
        return Z_OK;
    }
    if (bits > 16 || state->bits + (unsigned int)bits > 32)
        return Z_STREAM_ERROR;
    value &= (1L << bits) - 1;
    state->hold += (uint64_t)value << state->bits;
    state->bits += (unsigned int)bits;
    return Z_OK;
}